

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::readEditMetaData(PtexReader *this)

{
  bool bVar1;
  reference pvVar2;
  FilePos FVar3;
  PtexReader *in_RDI;
  MetaEdit *e;
  EditMetaDataHeader emdh;
  value_type *__x;
  undefined8 in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  PtexReader *in_stack_ffffffffffffffe8;
  int local_10;
  int local_c;
  
  bVar1 = readBlock(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                    (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                    SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x18,0));
  if (bVar1) {
    __x = (value_type *)&in_RDI->_metaedits;
    memset(&stack0xffffffffffffffe0,0,0x10);
    std::vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
    ::push_back((vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
                 *)in_RDI,__x);
    pvVar2 = std::
             vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
             ::back((vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
                     *)in_RDI);
    FVar3 = tell(in_RDI);
    pvVar2->pos = FVar3;
    pvVar2->zipsize = local_10;
    pvVar2->memsize = local_c;
  }
  return;
}

Assistant:

void PtexReader::readEditMetaData()
{
    // read header
    EditMetaDataHeader emdh;
    if (!readBlock(&emdh, EditMetaDataHeaderSize)) return;

    // record header info for later
    _metaedits.push_back(MetaEdit());
    MetaEdit& e = _metaedits.back();
    e.pos = tell();
    e.zipsize = emdh.metadatazipsize;
    e.memsize = emdh.metadatamemsize;
}